

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O2

void psh_globals_scale_widths(PSH_Globals globals,FT_UInt direction)

{
  FT_UInt FVar1;
  long lVar2;
  long lVar3;
  PSH_WidthRec *pPVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  FVar1 = globals->dimension[direction].stdw.count;
  if (FVar1 != 0) {
    lVar2 = (long)(int)globals->dimension[direction].scale_mult;
    lVar3 = globals->dimension[direction].stdw.widths[0].org * lVar2;
    lVar3 = (long)(int)((ulong)(lVar3 + (lVar3 >> 0x3f) + 0x8000) >> 0x10);
    globals->dimension[direction].stdw.widths[0].cur = lVar3;
    globals->dimension[direction].stdw.widths[0].fit = lVar3 + 0x20U & 0xffffffffffffffc0;
    pPVar4 = globals->dimension[direction].stdw.widths;
    while (pPVar4 = pPVar4 + 1, FVar1 = FVar1 - 1, FVar1 != 0) {
      lVar3 = pPVar4->org * lVar2;
      lVar5 = (long)(int)((ulong)(lVar3 + (lVar3 >> 0x3f) + 0x8000) >> 0x10);
      lVar3 = globals->dimension[direction].stdw.widths[0].cur;
      uVar6 = lVar5 - lVar3;
      uVar7 = -uVar6;
      if (0 < (long)uVar6) {
        uVar7 = uVar6;
      }
      if (0x7f < uVar7) {
        lVar3 = lVar5;
      }
      pPVar4->cur = lVar3;
      pPVar4->fit = lVar3 + 0x20U & 0xffffffffffffffc0;
    }
  }
  return;
}

Assistant:

static void
  psh_globals_scale_widths( PSH_Globals  globals,
                            FT_UInt      direction )
  {
    PSH_Dimension  dim   = &globals->dimension[direction];
    PSH_Widths     stdw  = &dim->stdw;
    FT_UInt        count = stdw->count;
    PSH_Width      width = stdw->widths;
    PSH_Width      stand = width;               /* standard width/height */
    FT_Fixed       scale = dim->scale_mult;


    if ( count > 0 )
    {
      width->cur = FT_MulFix( width->org, scale );
      width->fit = FT_PIX_ROUND( width->cur );

      width++;
      count--;

      for ( ; count > 0; count--, width++ )
      {
        FT_Pos  w, dist;


        w    = FT_MulFix( width->org, scale );
        dist = w - stand->cur;

        if ( dist < 0 )
          dist = -dist;

        if ( dist < 128 )
          w = stand->cur;

        width->cur = w;
        width->fit = FT_PIX_ROUND( w );
      }
    }
  }